

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# normalizer2impl.cpp
# Opt level: O2

uint8_t * __thiscall
icu_63::Normalizer2Impl::decomposeShort
          (Normalizer2Impl *this,uint8_t *src,uint8_t *limit,UBool stopAtCompBoundary,
          UBool onlyContiguous,ReorderingBuffer *buffer,UErrorCode *errorCode)

{
  byte bVar1;
  byte bVar2;
  undefined2 uVar3;
  UCPTrie *trie;
  uint16_t *puVar4;
  char cVar5;
  UBool UVar6;
  ushort norm16;
  ushort uVar7;
  uint uVar8;
  int c;
  UChar32 UVar9;
  int32_t iVar10;
  ulong uVar11;
  uint8_t uVar12;
  byte *cpLimit;
  char16_t jamos [3];
  
  if (U_ZERO_ERROR < *errorCode) {
    return (uint8_t *)0x0;
  }
LAB_0027edea:
  do {
    if (limit <= src) {
      return src;
    }
    cpLimit = src + 1;
    bVar1 = *src;
    uVar8 = (uint)bVar1;
    if ((char)bVar1 < '\0') {
      if (cpLimit != limit) {
        uVar8 = (uint)bVar1;
        if (bVar1 < 0xe0) {
          if ((0xc1 < bVar1) && ((byte)(*cpLimit ^ 0x80) < 0x40)) {
            uVar8 = (uint)this->normTrie->index[uVar8 & 0x1f] + (*cpLimit ^ 0x80);
LAB_0027ee9f:
            cpLimit = cpLimit + 1;
            goto LAB_0027ef22;
          }
        }
        else if (bVar1 < 0xf0) {
          bVar1 = *cpLimit;
          if (((((byte)" 000000000000\x1000"[uVar8 & 0xf] >> (bVar1 >> 5) & 1) != 0) &&
              (cpLimit = src + 2, cpLimit != limit)) && ((byte)(*cpLimit ^ 0x80) < 0x40)) {
            uVar8 = (uint)*(ushort *)
                           ((long)this->normTrie->index +
                           (ulong)((uVar8 & 0xf) * 0x80 + (bVar1 & 0x3f) * 2)) + (*cpLimit ^ 0x80);
            goto LAB_0027ee9f;
          }
        }
        else if (bVar1 < 0xf5) {
          bVar1 = *cpLimit;
          if ((((((uint)(int)""[bVar1 >> 4] >> (uVar8 - 0xf0 & 0x1f) & 1) != 0) &&
               (cpLimit = src + 2, cpLimit != limit)) &&
              (bVar2 = *cpLimit, (byte)(bVar2 + 0x80) < 0x40)) &&
             ((cpLimit = src + 3, cpLimit != limit && ((byte)(*cpLimit + 0x80) < 0x40)))) {
            uVar8 = bVar1 & 0x3f | (uVar8 - 0xf0) * 0x40;
            trie = this->normTrie;
            if (uVar8 < trie->shifted12HighStart) {
              uVar8 = ucptrie_internalSmallU8Index_63(trie,uVar8,bVar2 + 0x80,*cpLimit + 0x80);
            }
            else {
              uVar8 = trie->dataLength - 2;
            }
            goto LAB_0027ee9f;
          }
        }
      }
      uVar8 = this->normTrie->dataLength - 1;
    }
LAB_0027ef22:
    norm16 = *(ushort *)((long)(this->normTrie->data).ptr0 + (long)(int)uVar8 * 2);
    if (norm16 < this->limitNoNo) {
      if ((stopAtCompBoundary != '\0') && (norm16 < this->minNoNoCompNoMaybeCC)) {
        return src;
      }
      uVar7 = this->minYesNo;
      c = -1;
      if (uVar7 <= norm16) goto LAB_0027efc2;
LAB_0027ef54:
      c = anon_unknown_16::codePointFromValidUTF8(src,cpLimit);
LAB_0027efad:
      cVar5 = ReorderingBuffer::append(buffer,c,'\0',errorCode);
joined_r0x0027f0dc:
      if (cVar5 == '\0') {
        return (uint8_t *)0x0;
      }
      src = cpLimit;
      if ((stopAtCompBoundary != '\0') &&
         (UVar6 = norm16HasCompBoundaryAfter(this,norm16,onlyContiguous), UVar6 != '\0')) {
        return cpLimit;
      }
      goto LAB_0027edea;
    }
    if (norm16 < this->minMaybeYes) {
      if (stopAtCompBoundary != '\0') {
        return src;
      }
      UVar9 = anon_unknown_16::codePointFromValidUTF8(src,cpLimit);
      c = ((uint)(norm16 >> 3) + UVar9) - (uint)this->centerNoNoDelta;
      norm16 = getRawNorm16(this,c);
      uVar7 = this->minYesNo;
      if (norm16 < uVar7) {
        if (c < 0) goto LAB_0027ef54;
        goto LAB_0027efad;
      }
LAB_0027efc2:
      if ((uVar7 == norm16) || (uVar3 = this->minYesNoMappingsOnly, (uVar3 | 1) == norm16)) {
        if (c < 0) {
          c = anon_unknown_16::codePointFromValidUTF8(src,cpLimit);
        }
        iVar10 = Hangul::decompose(c,jamos);
        cVar5 = ReorderingBuffer::appendZeroCC(buffer,jamos,jamos + iVar10,errorCode);
      }
      else {
        puVar4 = this->extraData;
        uVar11 = (ulong)(norm16 & 0xfffe);
        uVar7 = *(ushort *)((long)puVar4 + uVar11);
        if ((char)uVar7 < '\0') {
          uVar12 = *(uint8_t *)((long)puVar4 + (uVar11 - 1));
        }
        else {
          uVar12 = '\0';
        }
        cVar5 = ReorderingBuffer::append
                          (buffer,(UChar *)((long)puVar4 + uVar11 + 2),uVar7 & 0x1f,'\x01',uVar12,
                           (uint8_t)(uVar7 >> 8),errorCode);
      }
      goto joined_r0x0027f0dc;
    }
    UVar9 = anon_unknown_16::codePointFromValidUTF8(src,cpLimit);
    uVar12 = (uint8_t)(norm16 >> 1);
    if (norm16 < 0xfc00) {
      uVar12 = '\0';
    }
    UVar6 = ReorderingBuffer::append(buffer,UVar9,uVar12,errorCode);
    src = cpLimit;
    if (UVar6 == '\0') {
      return (uint8_t *)0x0;
    }
  } while( true );
}

Assistant:

const uint8_t *
Normalizer2Impl::decomposeShort(const uint8_t *src, const uint8_t *limit,
                                UBool stopAtCompBoundary, UBool onlyContiguous,
                                ReorderingBuffer &buffer, UErrorCode &errorCode) const {
    if (U_FAILURE(errorCode)) {
        return nullptr;
    }
    while (src < limit) {
        const uint8_t *prevSrc = src;
        uint16_t norm16;
        UCPTRIE_FAST_U8_NEXT(normTrie, UCPTRIE_16, src, limit, norm16);
        // Get the decomposition and the lead and trail cc's.
        UChar32 c = U_SENTINEL;
        if (norm16 >= limitNoNo) {
            if (isMaybeOrNonZeroCC(norm16)) {
                // No boundaries around this character.
                c = codePointFromValidUTF8(prevSrc, src);
                if (!buffer.append(c, getCCFromYesOrMaybe(norm16), errorCode)) {
                    return nullptr;
                }
                continue;
            }
            // Maps to an isCompYesAndZeroCC.
            if (stopAtCompBoundary) {
                return prevSrc;
            }
            c = codePointFromValidUTF8(prevSrc, src);
            c = mapAlgorithmic(c, norm16);
            norm16 = getRawNorm16(c);
        } else if (stopAtCompBoundary && norm16 < minNoNoCompNoMaybeCC) {
            return prevSrc;
        }
        // norm16!=INERT guarantees that [prevSrc, src[ is valid UTF-8.
        // We do not see invalid UTF-8 here because
        // its norm16==INERT is normalization-inert,
        // so it gets copied unchanged in the fast path,
        // and we stop the slow path where invalid UTF-8 begins.
        U_ASSERT(norm16 != INERT);
        if (norm16 < minYesNo) {
            if (c < 0) {
                c = codePointFromValidUTF8(prevSrc, src);
            }
            // does not decompose
            if (!buffer.append(c, 0, errorCode)) {
                return nullptr;
            }
        } else if (isHangulLV(norm16) || isHangulLVT(norm16)) {
            // Hangul syllable: decompose algorithmically
            if (c < 0) {
                c = codePointFromValidUTF8(prevSrc, src);
            }
            char16_t jamos[3];
            if (!buffer.appendZeroCC(jamos, jamos+Hangul::decompose(c, jamos), errorCode)) {
                return nullptr;
            }
        } else {
            // The character decomposes, get everything from the variable-length extra data.
            const uint16_t *mapping = getMapping(norm16);
            uint16_t firstUnit = *mapping;
            int32_t length = firstUnit & MAPPING_LENGTH_MASK;
            uint8_t trailCC = (uint8_t)(firstUnit >> 8);
            uint8_t leadCC;
            if (firstUnit & MAPPING_HAS_CCC_LCCC_WORD) {
                leadCC = (uint8_t)(*(mapping-1) >> 8);
            } else {
                leadCC = 0;
            }
            if (!buffer.append((const char16_t *)mapping+1, length, TRUE, leadCC, trailCC, errorCode)) {
                return nullptr;
            }
        }
        if (stopAtCompBoundary && norm16HasCompBoundaryAfter(norm16, onlyContiguous)) {
            return src;
        }
    }
    return src;
}